

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fountain.c
# Opt level: O2

void dipfountain(obj *obj)

{
  undefined1 *puVar1;
  level *plVar2;
  boolean bVar3;
  xchar xVar4;
  xchar xVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  obj *otmp;
  long lVar10;
  long lVar11;
  obj **obj_00;
  long lVar12;
  
  if ((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
     ((youmonst.data)->mlet == '\x05')) {
    floating_above("fountain");
    return;
  }
  if ((((obj->otyp == 0x26) && (obj->quan == 1)) && (4 < u.ulevel)) &&
     ((uVar6 = mt_random(), uVar6 % 6 == 0 && (obj->oartifact == '\0')))) {
    pcVar8 = artiname(1);
    bVar3 = exist_artifact(0x26,pcVar8);
    if (bVar3 == '\0') {
      if (u.ualign.type == '\x01') {
        pline("From the murky depths, a hand reaches up to bless the sword.");
        pline("As the hand retreats, the fountain disappears!");
        pcVar8 = artiname(1);
        otmp = oname(obj,pcVar8);
        discover_artifact('\x01');
        bless(otmp);
        *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xffffe0ff | 0x1000;
        bVar3 = '\x01';
      }
      else {
        pline("A freezing mist rises from the water and envelopes the sword.");
        pline("The fountain disappears!");
        curse(obj);
        if ((-6 < obj->spe) && (uVar6 = mt_random(), uVar6 % 3 == 0)) {
          obj->spe = obj->spe + -1;
        }
        obj->field_0x4b = obj->field_0x4b & 0xef;
        bVar3 = '\0';
      }
      exercise(2,bVar3);
      update_inventory();
      plVar2 = level;
      xVar4 = u.ux;
      lVar11 = (long)u.uy;
      level->locations[u.ux][lVar11].typ = '\x19';
      puVar1 = &plVar2->locations[xVar4][lVar11].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
      newsym((int)u.ux,(int)u.uy);
      (level->flags).nfountains = (level->flags).nfountains + 0xff;
      bVar3 = in_town((int)u.ux,(int)u.uy);
      if (bVar3 == '\0') {
        return;
      }
      angry_guards('\0');
      return;
    }
  }
  bVar3 = get_wet(obj);
  if ((bVar3 != '\0') && (uVar6 = mt_random(), (uVar6 & 1) == 0)) {
    return;
  }
  if (obj->otyp == 0x141) {
    useup(obj);
    return;
  }
  iVar7 = rnd(0x1e);
  switch(iVar7) {
  case 0x10:
    curse(obj);
    break;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
    if ((obj->field_0x4a & 1) != 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019aa82;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019aa79;
LAB_0019ac89:
        pline("The water glows for a moment.");
      }
      else {
LAB_0019aa79:
        if (ublindf != (obj *)0x0) {
LAB_0019aa82:
          if (ublindf->oartifact == '\x1d') goto LAB_0019ac89;
        }
      }
      uncurse(obj);
      break;
    }
    pcVar8 = "A feeling of loss comes over you.";
    goto LAB_0019aa98;
  case 0x15:
    dowaterdemon();
    break;
  case 0x16:
    dowaternymph();
    break;
  case 0x17:
    dowatersnakes();
    break;
  case 0x18:
    if ((level->locations[u.ux][u.uy].field_0x6 & 0x10) == 0) {
      dofindgem();
      break;
    }
  case 0x19:
    dogushforth(0);
    break;
  case 0x1a:
    pcVar8 = body_part(0);
    pline("A strange tingling runs up your %s.",pcVar8);
    break;
  case 0x1b:
    pcVar8 = "You feel a sudden chill.";
LAB_0019aa98:
    pline(pcVar8);
    break;
  case 0x1c:
    pline("An urge to take a bath overwhelms you.");
    obj_00 = &invent;
    lVar11 = money_cnt(invent);
    if (10 < lVar11) {
      lVar11 = somegold(lVar11);
      lVar11 = lVar11 / 10;
      while ((obj_00 = &((obj *)obj_00)->nobj->nobj, (obj *)obj_00 != (obj *)0x0 && (0 < lVar11))) {
        if (((obj *)obj_00)->oclass == '\f') {
          lVar10 = (long)objects[((obj *)obj_00)->otyp].oc_cost;
          lVar9 = (lVar11 + lVar10 + -1) / lVar10;
          iVar7 = ((obj *)obj_00)->quan;
          lVar12 = (long)iVar7;
          if (lVar9 < iVar7) {
            lVar12 = lVar9;
          }
          lVar11 = lVar11 - lVar12 * lVar10;
          iVar7 = iVar7 - (int)lVar12;
          ((obj *)obj_00)->quan = iVar7;
          if (iVar7 == 0) {
            delobj((obj *)obj_00);
          }
        }
      }
      pline("You lost some of your money in the fountain!");
      puVar1 = &level->locations[u.ux][u.uy].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffffffef;
      exercise(2,'\0');
    }
    break;
  case 0x1d:
    uVar6 = *(uint *)&level->locations[u.ux][u.uy].field_0x6;
    if ((uVar6 & 0x10) != 0) break;
    *(uint *)&level->locations[u.ux][u.uy].field_0x6 = uVar6 | 0x10;
    xVar4 = dunlevs_in_dungeon(&u.uz);
    xVar5 = dunlev(&u.uz);
    iVar7 = rnd(((int)xVar4 - (int)xVar5) * 2 + 2);
    mkgold((ulong)(iVar7 + 5),level,(int)u.ux,(int)u.uy);
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019ac30;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019ac27;
LAB_0019ae4a:
      pline("Far below you, you see coins glistening in the water.");
    }
    else {
LAB_0019ac27:
      if (ublindf != (obj *)0x0) {
LAB_0019ac30:
        if (ublindf->oartifact == '\x1d') goto LAB_0019ae4a;
      }
    }
    exercise(2,'\x01');
    newsym((int)u.ux,(int)u.uy);
  }
  update_inventory();
  dryup(u.ux,u.uy,'\x01');
  return;
}

Assistant:

void dipfountain(struct obj *obj)
{
	if (Levitation) {
		floating_above("fountain");
		return;
	}

	/* Don't grant Excalibur when there's more than one object.  */
	/* (quantity could be > 1 if merged daggers got polymorphed) */
	if (obj->otyp == LONG_SWORD && obj->quan == 1L
	    && u.ulevel >= 5 && !rn2(6)
	    && !obj->oartifact
	    && !exist_artifact(LONG_SWORD, artiname(ART_EXCALIBUR))) {

		if (u.ualign.type != A_LAWFUL) {
			/* Ha!  Trying to cheat her. */
			pline("A freezing mist rises from the water and envelopes the sword.");
			pline("The fountain disappears!");
			curse(obj);
			if (obj->spe > -6 && !rn2(3)) obj->spe--;
			obj->oerodeproof = FALSE;
			exercise(A_WIS, FALSE);
		} else {
			/* The lady of the lake acts! - Eric Backus */
			/* Be *REAL* nice */
	  pline("From the murky depths, a hand reaches up to bless the sword.");
			pline("As the hand retreats, the fountain disappears!");
			obj = oname(obj, artiname(ART_EXCALIBUR));
			discover_artifact(ART_EXCALIBUR);
			bless(obj);
			obj->oeroded = obj->oeroded2 = 0;
			obj->oerodeproof = TRUE;
			exercise(A_WIS, TRUE);
		}
		update_inventory();
		level->locations[u.ux][u.uy].typ = ROOM;
		level->locations[u.ux][u.uy].looted = 0;
		newsym(u.ux, u.uy);
		level->flags.nfountains--;
		if (in_town(u.ux, u.uy))
		    angry_guards(FALSE);
		return;
	} else if (get_wet(obj) && !rn2(2))
		return;

	/* Acid and water don't mix */
	if (obj->otyp == POT_ACID) {
	    useup(obj);
	    return;
	}

	switch (rnd(30)) {
		case 16: /* Curse the item */
			curse(obj);
			break;
		case 17:
		case 18:
		case 19:
		case 20: /* Uncurse the item */
			if (obj->cursed) {
			    if (!Blind)
				pline("The water glows for a moment.");
			    uncurse(obj);
			} else {
			    pline("A feeling of loss comes over you.");
			}
			break;
		case 21: /* Water Demon */
			dowaterdemon();
			break;
		case 22: /* Water Nymph */
			dowaternymph();
			break;
		case 23: /* an Endless Stream of Snakes */
			dowatersnakes();
			break;
		case 24: /* Find a gem */
			if (!FOUNTAIN_IS_LOOTED(u.ux,u.uy)) {
				dofindgem();
				break;
			}
		case 25: /* Water gushes forth */
			dogushforth(FALSE);
			break;
		case 26: /* Strange feeling */
			pline("A strange tingling runs up your %s.",
							body_part(ARM));
			break;
		case 27: /* Strange feeling */
			pline("You feel a sudden chill.");
			break;
		case 28: /* Strange feeling */
			pline("An urge to take a bath overwhelms you.");
			{
			    long money = money_cnt(invent);
			    struct obj *otmp;
                            if (money > 10) {
				/* Amount to loose.  Might get rounded up as fountains don't pay change... */
			        money = somegold(money) / 10; 
			        for (otmp = invent; otmp && money > 0; otmp = otmp->nobj) if (otmp->oclass == COIN_CLASS) {
				    int denomination = objects[otmp->otyp].oc_cost;
				    long coin_loss = (money + denomination - 1) / denomination;
                                    coin_loss = min(coin_loss, otmp->quan);
				    otmp->quan -= coin_loss;
				    money -= coin_loss * denomination;				  
				    if (!otmp->quan) delobj(otmp);
				}
			        pline("You lost some of your money in the fountain!");
				CLEAR_FOUNTAIN_LOOTED(u.ux,u.uy);
			        exercise(A_WIS, FALSE);
                            }
			}
			break;
		case 29: /* You see coins */

		/* We make fountains have more coins the closer you are to the
		 * surface.  After all, there will have been more people going
		 * by.	Just like a shopping mall!  Chris Woodbury  */

		    if (FOUNTAIN_IS_LOOTED(u.ux,u.uy)) break;
		    SET_FOUNTAIN_LOOTED(u.ux,u.uy);
		    mkgold((long)
			(rnd((dunlevs_in_dungeon(&u.uz)-dunlev(&u.uz)+1)*2)+5),
			level, u.ux, u.uy);
		    if (!Blind)
		pline("Far below you, you see coins glistening in the water.");
		    exercise(A_WIS, TRUE);
		    newsym(u.ux,u.uy);
		    break;
	}
	update_inventory();
	dryup(u.ux, u.uy, TRUE);
}